

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O3

void __thiscall
soplex::SPxGeometSC<double>::scale(SPxGeometSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char cVar1;
  pointer pdVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  undefined1 *puVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  SPxOut *pSVar12;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  bool bVar13;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar14;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Verbosity old_verbosity_2;
  vector<double,_std::allocator<double>_> rowscale;
  vector<double,_std::allocator<double>_> colscale;
  undefined4 local_c4;
  value_type_conflict2 local_c0;
  double local_b8;
  double local_b0;
  Real local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  double local_40;
  double local_38;
  
  pSVar12 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar12 != (SPxOut *)0x0) && (2 < (int)pSVar12->m_verbosity)) {
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_60.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,3);
    local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = pSVar12->m_verbosity;
    (*pSVar12->_vptr_SPxOut[2])();
    pSVar12 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],"Geometric scaling LP",0x14);
    pcVar10 = " (persistent)";
    if (!persistent) {
      pcVar10 = "";
    }
    lVar6 = 0xd;
    if (!persistent) {
      lVar6 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],pcVar10,lVar6);
    pcVar10 = " with post-equilibration";
    bVar13 = this->postequilibration == false;
    if (bVar13) {
      pcVar10 = "";
    }
    lVar6 = 0x18;
    if (bVar13) {
      lVar6 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],pcVar10,lVar6);
    cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18)
                    + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar12 = (this->super_SPxScaler<double>).spxout;
    (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_a0);
  }
  (**(this->super_SPxScaler<double>)._vptr_SPxScaler)(this,lp);
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
  local_78 = extraout_XMM0_Qa;
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
  this_00 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_80 = extraout_XMM0_Qa_00;
  local_a8 = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_88 = local_80;
  if (local_80 <= local_78) {
    local_88 = local_78;
  }
  pSVar12 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar12 != (SPxOut *)0x0) && (3 < (int)pSVar12->m_verbosity)) {
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_60.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,4);
    local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = pSVar12->m_verbosity;
    (*pSVar12->_vptr_SPxOut[2])();
    pSVar12 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," min= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," col-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," row-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_80);
    cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18)
                    + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar12 = (this->super_SPxScaler<double>).spxout;
    (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_a0);
  }
  local_b8 = this->m_goodEnoughRatio;
  if (local_88 <= local_b8) {
    pSVar12 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar12 != (SPxOut *)0x0) && (3 < (int)pSVar12->m_verbosity)) {
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_60.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,4);
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = pSVar12->m_verbosity;
      (*pSVar12->_vptr_SPxOut[2])();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],
                 "No geometric scaling done, ratio good enough",0x2c);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_a0);
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar12 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar12 != (SPxOut *)0x0) && (3 < (int)pSVar12->m_verbosity)) {
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_60.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,4);
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = pSVar12->m_verbosity;
      (*pSVar12->_vptr_SPxOut[2])();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],
                 " ... but will still perform equilibrium scaling",0x2f);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_a0);
    }
  }
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_a0,
             (ulong)(uint)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
             (value_type_conflict2 *)&local_60,(allocator_type *)&local_c0);
  local_c0 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,
             (ulong)(uint)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
             &local_c0,(allocator_type *)&local_c4);
  if (local_88 <= local_b8) {
LAB_0022909a:
    auVar5 = _DAT_003561b0;
    auVar4 = _DAT_003561a0;
    bVar13 = this->postequilibration == false;
    if (bVar13) {
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      if ((pSVar12 != (SPxOut *)0x0) && (3 < (int)pSVar12->m_verbosity)) {
        local_c0 = (value_type_conflict2)CONCAT44(local_c0._4_4_,pSVar12->m_verbosity);
        local_c4 = 4;
        (*pSVar12->_vptr_SPxOut[2])();
        pSVar12 = (this->super_SPxScaler<double>).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar12->m_streams[pSVar12->m_verbosity],"No geometric scaling done.",0x1a);
        cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        pSVar12 = (this->super_SPxScaler<double>).spxout;
        (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_c0);
      }
      lp->_isScaled = true;
      goto LAB_00229617;
    }
    vecExp = (this->super_SPxScaler<double>).m_activeColscaleExp;
    vecExp_00 = (this->super_SPxScaler<double>).m_activeRowscaleExp;
    if (!bVar13) {
      pdVar2 = (pointer)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (Verbosity)
                                 local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      if (pdVar2 != local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        uVar7 = (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + (-8 - (long)pdVar2);
        auVar19._8_4_ = (int)uVar7;
        auVar19._0_8_ = uVar7;
        auVar19._12_4_ = (int)(uVar7 >> 0x20);
        auVar15._0_8_ = uVar7 >> 3;
        auVar15._8_8_ = auVar19._8_8_ >> 3;
        uVar11 = 0;
        auVar15 = auVar15 ^ _DAT_003561b0;
        do {
          auVar18._8_4_ = (int)uVar11;
          auVar18._0_8_ = uVar11;
          auVar18._12_4_ = (int)(uVar11 >> 0x20);
          auVar19 = (auVar18 | auVar4) ^ auVar5;
          if ((bool)(~(auVar19._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar19._0_4_ ||
                      auVar15._4_4_ < auVar19._4_4_) & 1)) {
            pdVar2[uVar11] = 1.0;
          }
          if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
              auVar19._12_4_ <= auVar15._12_4_) {
            pdVar2[uVar11 + 1] = 1.0;
          }
          uVar11 = uVar11 + 2;
        } while (((uVar7 >> 3) + 2 & 0x3ffffffffffffffe) != uVar11);
      }
      auVar5 = _DAT_003561b0;
      auVar4 = _DAT_003561a0;
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar8 = (undefined1 *)
                 ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                 (-8 - (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start));
        auVar16._8_4_ = (int)puVar8;
        auVar16._0_8_ = puVar8;
        auVar16._12_4_ = (int)((ulong)puVar8 >> 0x20);
        auVar17._0_8_ = (ulong)puVar8 >> 3;
        auVar17._8_8_ = auVar16._8_8_ >> 3;
        uVar7 = 0;
        auVar17 = auVar17 ^ _DAT_003561b0;
        do {
          auVar20._8_4_ = (int)uVar7;
          auVar20._0_8_ = uVar7;
          auVar20._12_4_ = (int)(uVar7 >> 0x20);
          auVar19 = (auVar20 | auVar4) ^ auVar5;
          if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                      auVar17._4_4_ < auVar19._4_4_) & 1)) {
            local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = 1.0;
          }
          if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
              auVar19._12_4_ <= auVar17._12_4_) {
            local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7 + 1] = 1.0;
          }
          uVar7 = uVar7 + 2;
        } while ((((ulong)puVar8 >> 3) + 2 & 0x3ffffffffffffffe) != uVar7);
      }
      goto LAB_002292c0;
    }
LAB_002292dd:
    SPxScaler<double>::computeExpVec(&this->super_SPxScaler<double>,&local_60,vecExp);
    SPxScaler<double>::computeExpVec(&this->super_SPxScaler<double>,&local_a0,vecExp_00);
  }
  else {
    local_48 = local_78;
    if (local_80 <= local_78) {
      local_48 = local_80;
    }
    if (this->m_maxIterations < 1) {
      dVar14 = this->m_minImprovement;
      local_b8 = 0.0;
      local_b0 = 0.0;
    }
    else {
      iVar9 = 0;
      local_b0 = local_88;
      local_b8 = local_48;
      do {
        local_38 = local_b8;
        local_40 = local_b0;
        if (local_80 <= local_78) {
          local_70 = computeScalingVec<double>((SVSetBase<double> *)lp,&local_60,&local_a0,local_a8)
          ;
          local_b0 = computeScalingVec<double>
                               (&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,&local_a0,
                                &local_60,local_a8);
          local_b8 = local_70;
          local_68 = local_b0;
        }
        else {
          local_68 = computeScalingVec<double>
                               (&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,&local_a0,
                                &local_60,local_a8);
          local_b0 = computeScalingVec<double>((SVSetBase<double> *)lp,&local_60,&local_a0,local_a8)
          ;
          local_b8 = local_68;
          local_70 = local_b0;
        }
        pSVar12 = (this->super_SPxScaler<double>).spxout;
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          local_c0 = (value_type_conflict2)CONCAT44(local_c0._4_4_,pSVar12->m_verbosity);
          local_c4 = 5;
          (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_c4);
          pSVar12 = (this->super_SPxScaler<double>).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar12->m_streams[pSVar12->m_verbosity],"Geometric scaling round ",0x18);
          std::ostream::operator<<((ostream *)pSVar12->m_streams[pSVar12->m_verbosity],iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar12->m_streams[pSVar12->m_verbosity]," col-ratio= ",0xc);
          std::ostream::_M_insert<double>(local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar12->m_streams[pSVar12->m_verbosity]," row-ratio= ",0xc);
          std::ostream::_M_insert<double>(local_70);
          cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1
                         );
          std::ostream::put(cVar1);
          std::ostream::flush();
          (*((this->super_SPxScaler<double>).spxout)->_vptr_SPxOut[2])();
        }
        dVar14 = this->m_minImprovement;
      } while (((local_b8 <= local_38 * dVar14) || (local_b0 <= local_40 * dVar14)) &&
              (iVar9 = iVar9 + 1, iVar9 < this->m_maxIterations));
    }
    if ((local_48 * dVar14 < local_b8) && (local_88 * dVar14 < local_b0)) goto LAB_0022909a;
    vecExp = (this->super_SPxScaler<double>).m_activeColscaleExp;
    vecExp_00 = (this->super_SPxScaler<double>).m_activeRowscaleExp;
    if ((this->postequilibration & 1U) == 0) goto LAB_002292dd;
LAB_002292c0:
    SPxEquiliSC<double>::computePostequiExpVecs(lp,&local_a0,&local_60,vecExp_00,vecExp,local_a8);
  }
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[2])(this,lp);
  pSVar12 = (this->super_SPxScaler<double>).spxout;
  if (pSVar12 != (SPxOut *)0x0) {
    if (4 < (int)pSVar12->m_verbosity) {
      local_c0 = (value_type_conflict2)CONCAT44(local_c0._4_4_,pSVar12->m_verbosity);
      local_c4 = 5;
      (*pSVar12->_vptr_SPxOut[2])();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],"Row scaling min= ",0x11);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x31])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x32])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],"IGEOSC06 Col scaling min= ",0x1a);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x2f])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_05);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x30])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_06);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_c0);
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      if (pSVar12 == (SPxOut *)0x0) goto LAB_00229617;
    }
    if (3 < (int)pSVar12->m_verbosity) {
      local_c0 = (value_type_conflict2)CONCAT44(local_c0._4_4_,pSVar12->m_verbosity);
      local_c4 = 4;
      (*pSVar12->_vptr_SPxOut[2])();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," min= ",6);
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,0);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_07);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,0);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_08);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," col-ratio= ",0xc);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_09);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," row-ratio= ",0xc);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_10);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar12 = (this->super_SPxScaler<double>).spxout;
      (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_c0);
    }
  }
LAB_00229617:
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (Verbosity)
                            local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}